

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

error try_reuse(context *ctx,token *token,opcode *op,int address)

{
  uint flag;
  int iVar1;
  undefined4 in_register_0000000c;
  int in_R8D;
  token local_50;
  
  iVar1 = equal((token *)op,".reuse");
  if (iVar1 != 0) {
    if (in_R8D == 8) {
      flag = 1;
    }
    else if (in_R8D == 0x27) {
      flag = 4;
    }
    else {
      if (in_R8D != 0x14) {
        fail((token *)ctx,(char *)op,"register cannot be reused");
        return (unique_ptr<char[],_std::default_delete<char[]>_>)
               (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
      }
      flag = 2;
    }
    opcode::add_reuse((opcode *)CONCAT44(in_register_0000000c,address),flag);
    context::tokenize(&local_50,(context *)token);
    *(int *)&op[2].value = local_50.column;
    op[1].value = (uint64_t)local_50.data.string._M_str;
    op[1].reuse = local_50.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_50.line;
    op->value = (uint64_t)local_50.filename;
    op->reuse = local_50.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_50.data.predicate.negated;
  }
  ctx->pc = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

error try_reuse(context& ctx, token& token, opcode& op, int address)
{
    if (!equal(token, ".reuse")) {
        return {};
    }
    switch (address) {
    case 8:
        op.add_reuse(reuse_flag::gpr8);
        break;
    case 20:
        op.add_reuse(reuse_flag::gpr20);
        break;
    case 39:
        op.add_reuse(reuse_flag::gpr39);
        break;
    default:
        return fail(token, "register cannot be reused");
    }

    token = ctx.tokenize();
    return {};
}